

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instancenorm.cpp
# Opt level: O0

int __thiscall
ncnn::InstanceNorm::forward_inplace(InstanceNorm *this,Mat *bottom_top_blob,Option *opt)

{
  long lVar1;
  int iVar2;
  long *in_RSI;
  long lVar3;
  long in_RDI;
  float fVar4;
  int i_2;
  float beta;
  float gamma;
  float b;
  float a;
  float var;
  int i_1;
  float tmp;
  float mean;
  int i;
  float sqsum;
  float sum;
  float *ptr;
  int q;
  int size;
  int c;
  int h;
  int w;
  Mat *m;
  int local_1a4;
  float local_198;
  float local_194;
  int local_18c;
  int local_180;
  float local_17c;
  float local_178;
  int local_114;
  
  lVar1 = in_RSI[7];
  iVar2 = *(int *)((long)in_RSI + 0x2c) * (int)in_RSI[6];
  for (local_114 = 0; local_114 < (int)lVar1; local_114 = local_114 + 1) {
    lVar3 = *in_RSI + in_RSI[8] * (long)local_114 * in_RSI[2];
    local_178 = 0.0;
    local_17c = 0.0;
    for (local_180 = 0; local_180 < iVar2; local_180 = local_180 + 1) {
      local_178 = *(float *)(lVar3 + (long)local_180 * 4) + local_178;
    }
    local_178 = local_178 / (float)iVar2;
    for (local_18c = 0; local_18c < iVar2; local_18c = local_18c + 1) {
      fVar4 = *(float *)(lVar3 + (long)local_18c * 4) - local_178;
      local_17c = fVar4 * fVar4 + local_17c;
    }
    if (*(int *)(in_RDI + 0xd8) == 0) {
      local_194 = 1.0 / SQRT(local_17c / (float)iVar2 + *(float *)(in_RDI + 0xd4));
      local_198 = -local_178 * local_194;
    }
    else {
      local_194 = *(float *)(*(long *)(in_RDI + 0xe0) + (long)local_114 * 4) /
                  SQRT(local_17c / (float)iVar2 + *(float *)(in_RDI + 0xd4));
      local_198 = -local_178 * local_194 +
                  *(float *)(*(long *)(in_RDI + 0x128) + (long)local_114 * 4);
    }
    for (local_1a4 = 0; local_1a4 < iVar2; local_1a4 = local_1a4 + 1) {
      *(float *)(lVar3 + (long)local_1a4 * 4) =
           *(float *)(lVar3 + (long)local_1a4 * 4) * local_194 + local_198;
    }
  }
  return 0;
}

Assistant:

int InstanceNorm::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // x = (x - mean) / (sqrt(var + eps)) * gamma + beta

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int c = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < c; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        // mean and var
        float sum = 0.f;
        float sqsum = 0.f;
        for (int i = 0; i < size; i++)
        {
            sum += ptr[i];
            //sqsum += ptr[i] * ptr[i];
        }
        float mean = sum / size;
        float tmp = 0.f;
        for (int i = 0; i < size; i++)
        {
            tmp = ptr[i] - mean;
            sqsum += tmp * tmp;
        }
        float var = sqsum / size;
        // the var maybe minus due to accuracy
        //float var = sqsum / size - mean * mean;

        float a;
        float b;
        if (affine)
        {
            float gamma = gamma_data[q];
            float beta = beta_data[q];

            a = gamma / (sqrtf(var + eps));
            b = -mean * a + beta;
        }
        else
        {
            a = 1.f / (sqrtf(var + eps));
            b = -mean * a;
        }

        for (int i = 0; i < size; i++)
        {
            ptr[i] = ptr[i] * a + b;
        }
    }

    return 0;
}